

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int sx_hashtbl_add(sx_hashtbl *tbl,uint32_t key,int value)

{
  byte bVar1;
  code *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (tbl->capacity <= tbl->count) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/hash.c",
                      0x11b,"tbl->count < tbl->capacity");
    pcVar2 = (code *)swi(3);
    iVar3 = (*pcVar2)();
    return iVar3;
  }
  bVar1 = (byte)tbl->_bitshift;
  uVar5 = (ulong)(key >> (bVar1 & 0x3f) ^ key) * -0x61c8864680b583eb >> (bVar1 & 0x3f);
  while( true ) {
    uVar4 = uVar5 & 0xffffffff;
    if (tbl->keys[uVar4] == 0) break;
    uVar5 = (ulong)((int)uVar5 + 1) % (ulong)(uint)tbl->capacity;
  }
  tbl->keys[uVar4] = key;
  tbl->values[uVar4] = value;
  tbl->count = tbl->count + 1;
  return (int)uVar5;
}

Assistant:

int sx_hashtbl_add(sx_hashtbl* tbl, uint32_t key, int value)
{
    sx_assert(tbl->count < tbl->capacity);

    uint32_t h = sx__fib_hash(key, tbl->_bitshift);
    uint32_t cnt = (uint32_t)tbl->capacity;
    while (tbl->keys[h] != 0) {
        h = (h + 1) % cnt;
    }

    sx_assert(tbl->keys[h] == 0);    // something went wrong!
    tbl->keys[h] = key;
    tbl->values[h] = value;
    ++tbl->count;
    return h;
}